

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O2

void __thiscall sparse_tree::preprocess(sparse_tree *this)

{
  ushort uVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  this->p2[0] = 1;
  iVar4 = 1;
  for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
    iVar4 = iVar4 * 2;
    this->p2[lVar3 + 1] = iVar4;
  }
  uVar1 = this->n;
  piVar2 = (this->logn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  uVar5 = 1;
  for (uVar6 = 1; uVar6 < (uint)uVar1 * 2; uVar6 = uVar6 + 1) {
    piVar2[uVar6] = iVar4 + -1;
    if (uVar6 == uVar5) {
      uVar5 = uVar5 * 2;
      piVar2[uVar6] = iVar4;
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void sparse_tree::preprocess(){
    // memorizing powers of 2
    p2[0] = 1;
    for (int i=1; i<maxSize; i++)
        p2[i] = p2[i-1]*2; 

    // memorizing all log(n) values
    int val = 1,ptr=0;
    for (int i=1; i<2*n; i++){
        logn[i] = ptr-1;
        if (val==i){
            val*=2;
            logn[i] = ptr;
            ptr++;
        }
    }          
}